

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_context.cpp
# Opt level: O3

void __thiscall jessilib::impl::timer_context::cancel(timer_context *this)

{
  shared_mutex *__rwlock;
  _Manager_type *pp_Var1;
  element_type *peVar2;
  _Manager_type p_Var3;
  int iVar4;
  timer_context *in_RAX;
  timer_manager *ptVar5;
  timer *ptVar6;
  timer_manager *ptVar7;
  pair<std::_Rb_tree_iterator<jessilib::impl::timer_context_*>,_std::_Rb_tree_iterator<jessilib::impl::timer_context_*>_>
  pVar8;
  timer_context *local_38;
  
  local_38 = in_RAX;
  ptVar5 = timer_manager::instance();
  ptVar6 = timer_manager::thread_callback_timer();
  peVar2 = (ptVar6->m_context).
           super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == this) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_mutex);
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&ptVar5->m_mutex);
  if (iVar4 == 0) {
    __rwlock = &this->m_mutex;
    iVar4 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if (iVar4 == 0x23) {
      std::__throw_system_error(0x23);
    }
    if ((this->m_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_38 = this;
      pVar8 = std::
              _Rb_tree<jessilib::impl::timer_context_*,_jessilib::impl::timer_context_*,_std::_Identity<jessilib::impl::timer_context_*>,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
              ::equal_range(&(ptVar5->m_active_timers)._M_t,&local_38);
      std::
      _Rb_tree<jessilib::impl::timer_context_*,_jessilib::impl::timer_context_*,_std::_Identity<jessilib::impl::timer_context_*>,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
      ::_M_erase_aux(&(ptVar5->m_active_timers)._M_t,(_Base_ptr)pVar8.first._M_node,
                     (_Base_ptr)pVar8.second._M_node);
      pp_Var1 = &(this->m_callback).super__Function_base._M_manager;
      p_Var3 = *pp_Var1;
      if (p_Var3 != (_Manager_type)0x0) {
        (*p_Var3)((_Any_data *)&this->m_callback,(_Any_data *)&this->m_callback,__destroy_functor);
        *pp_Var1 = (_Manager_type)0x0;
        (this->m_callback)._M_invoker = (_Invoker_type)0x0;
      }
      ptVar7 = timer_manager::instance();
      if ((this->m_self)._M_node != (_List_node_base *)&ptVar7->m_detached_timers) {
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&ptVar5->m_detached_timers_mutex);
        if (iVar4 != 0) {
          std::__throw_system_error(iVar4);
        }
        std::__cxx11::
        list<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
        ::_M_erase(&ptVar5->m_detached_timers,(this->m_self)._M_node);
        pthread_mutex_unlock((pthread_mutex_t *)&ptVar5->m_detached_timers_mutex);
      }
    }
    ptVar5->is_timeout = false;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    pthread_mutex_unlock((pthread_mutex_t *)&ptVar5->m_mutex);
    if (peVar2 == this) {
      std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
    }
    std::condition_variable::notify_one();
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void timer_context::cancel() {
	impl::timer_manager& manager = impl::timer_manager::instance();

	// Unlock mutex if it's currently being held by this thread
	bool needs_shared_lock = false;
	if (manager.thread_callback_timer().m_context.get() == this) {
		needs_shared_lock = true;
		m_mutex.unlock_shared();
	}

	{
		std::lock_guard<std::mutex> manager_guard(manager.m_mutex);
		std::lock_guard<std::shared_mutex> context_guard(m_mutex);

		if (!null()) {
			// Remove from active timers
			manager.m_active_timers.erase(this);

			// Nullify timer
			m_callback = nullptr;

			// Remove from detached timers (if it's detached)
			if (detached()) {
				std::lock_guard<std::mutex> detached_timers_lock(manager.m_detached_timers_mutex);
				manager.m_detached_timers.erase(m_self);
			}
		}

		manager.is_timeout = false;
	}

	// Re-lock mutex
	if (needs_shared_lock) {
		m_mutex.lock_shared();
	}

	manager.m_cvar.notify_one();
}